

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_xform.cpp
# Opt level: O3

bool __thiscall ON_Xform::IsZeroTransformation(ON_Xform *this,double tol)

{
  bool bVar1;
  ulong uVar2;
  double (*padVar3) [4];
  ulong uVar4;
  bool bVar5;
  double dVar6;
  
  bVar1 = true;
  uVar2 = 0;
  padVar3 = (double (*) [4])this;
  while (bVar1) {
    uVar4 = 0;
    while( true ) {
      dVar6 = ABS((*(double (*) [4])*padVar3)[uVar4]);
      bVar1 = tol >= dVar6;
      if ((tol < dVar6) || (2 < uVar4)) break;
      bVar5 = uVar4 == 2;
      uVar4 = uVar4 + 1;
      if (bVar5 && uVar2 == 3) goto LAB_0067b276;
    }
    if (tol < dVar6) goto LAB_0067b276;
    padVar3 = padVar3 + 1;
    bVar5 = 2 < uVar2;
    uVar2 = uVar2 + 1;
    if (bVar5) goto LAB_0067b276;
  }
  bVar1 = false;
LAB_0067b276:
  return (bool)(this->m_xform[3][3] == 1.0 & bVar1);
}

Assistant:

bool ON_Xform::IsZeroTransformation(double tol) const
{
	bool rc = true;
	for(int i=0; rc && i<4; i++)
		for (int j = 0; rc && j < 4; j++)
		{
			if (i == 3 && j == 3)
				continue;
			rc = fabs(m_xform[i][j]) <= tol;
		}
  return (rc && 1.0 == m_xform[3][3] );
}